

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_Boolean
isNodeInTree(UA_NodeStore *ns,UA_NodeId *leafNode,UA_NodeId *nodeToFind,UA_NodeId *referenceTypeIds,
            size_t referenceTypeIdsSize)

{
  size_t sVar1;
  UA_ReferenceNode *pUVar2;
  UA_Boolean UVar3;
  UA_NodeStoreEntry **ppUVar4;
  UA_Boolean UVar5;
  size_t sVar6;
  UA_NodeId *n2;
  size_t sVar7;
  
  UVar3 = UA_NodeId_equal(leafNode,nodeToFind);
  UVar5 = true;
  if (!UVar3) {
    ppUVar4 = findNode(ns,leafNode);
    if (ppUVar4 != (UA_NodeStoreEntry **)0x0) {
      sVar1 = ((*ppUVar4)->node).referencesSize;
      if (sVar1 != 0) {
        pUVar2 = ((*ppUVar4)->node).references;
        sVar6 = 0;
        do {
          if ((referenceTypeIdsSize != 0) && (pUVar2[sVar6].isInverse != false)) {
            n2 = referenceTypeIds;
            sVar7 = referenceTypeIdsSize;
            do {
              UVar3 = UA_NodeId_equal(&pUVar2[sVar6].referenceTypeId,n2);
              if ((UVar3) &&
                 (UVar3 = isNodeInTree(ns,&pUVar2[sVar6].targetId.nodeId,nodeToFind,referenceTypeIds
                                       ,referenceTypeIdsSize), UVar3)) {
                return true;
              }
              n2 = n2 + 1;
              sVar7 = sVar7 - 1;
            } while (sVar7 != 0);
          }
          sVar6 = sVar6 + 1;
        } while (sVar6 != sVar1);
      }
    }
    UVar5 = false;
  }
  return UVar5;
}

Assistant:

UA_Boolean
isNodeInTree(UA_NodeStore *ns, const UA_NodeId *leafNode, const UA_NodeId *nodeToFind,
             const UA_NodeId *referenceTypeIds, size_t referenceTypeIdsSize) {
    if(UA_NodeId_equal(leafNode, nodeToFind))
        return true;

    const UA_Node *node = UA_NodeStore_get(ns,leafNode);
    if(!node)
        return false;

    /* Search upwards in the tree */
    for(size_t i = 0; i < node->referencesSize; ++i) {
        if(!node->references[i].isInverse)
            continue;

        /* Recurse only for valid reference types */
        for(size_t j = 0; j < referenceTypeIdsSize; ++j) {
            if(UA_NodeId_equal(&node->references[i].referenceTypeId, &referenceTypeIds[j]) &&
               isNodeInTree(ns, &node->references[i].targetId.nodeId, nodeToFind,
                            referenceTypeIds, referenceTypeIdsSize))
                return true;
        }
    }
    return false;
}